

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall FSlide::HitSlideLine(FSlide *this,line_t *ld)

{
  double dVar1;
  double dVar2;
  int iVar3;
  double dVar4;
  bool bVar5;
  int iVar6;
  FSoundID *sound_id;
  AActor *pAVar7;
  bool bVar8;
  double dVar9;
  double dVar10;
  divline_t dll;
  divline_t dlv;
  FSoundID local_74;
  FSoundID local_70;
  FSoundID local_6c;
  divline_t local_68;
  divline_t local_48;
  
  dVar1 = (this->tmmove).X;
  dVar9 = (this->tmmove).Y;
  if (((dVar9 * dVar9 + dVar1 * dVar1 <= 16.0) || (!var_friction.Value)) ||
     (pAVar7 = this->slidemo, pAVar7->floorz < (pAVar7->__Pos).Z)) {
    bVar5 = false;
  }
  else {
    dVar1 = P_GetFriction(pAVar7,(double *)0x0);
    bVar5 = 0.90625 < dVar1;
  }
  dVar1 = (ld->delta).X;
  dVar9 = 0.0;
  if ((dVar1 != 0.0) || (NAN(dVar1))) {
    dVar2 = (ld->delta).Y;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      pAVar7 = this->slidemo;
      iVar6 = pAVar7->Sector->PortalGroup;
      iVar3 = ld->frontsector->PortalGroup;
      dVar10 = 0.0;
      if (iVar6 != iVar3) {
        iVar6 = iVar3 * Displacements.size + iVar6;
        dVar9 = Displacements.data.Array[iVar6].pos.X;
        dVar10 = Displacements.data.Array[iVar6].pos.Y;
      }
      dVar10 = (pAVar7->__Pos).Y + dVar10;
      dVar9 = (pAVar7->__Pos).X + dVar9;
      if (((byte)i_compatflags2 & 8) == 0) {
        bVar8 = 1.52587890625e-05 <
                dVar2 * ((ld->v1->p).X - dVar9) + dVar1 * (dVar10 - (ld->v1->p).Y);
      }
      else {
        iVar6 = P_VanillaPointOnLineSide(dVar9,dVar10,ld);
        bVar8 = iVar6 == 1;
      }
      dVar1 = c_atan2((ld->delta).Y,(ld->delta).X);
      dVar1 = dVar1 * 57.29577951308232;
      if (bVar8) {
        dVar1 = dVar1 + 180.0;
      }
      dVar2 = c_atan2((this->tmmove).Y,(this->tmmove).X);
      dVar4 = (double)SUB84(((dVar2 * 57.29577951308232 + 3600.0) - dVar1) * 11930464.711111112 +
                            6755399441055744.0,0) * 8.381903171539307e-08;
      dVar1 = (this->tmmove).X;
      dVar2 = (this->tmmove).Y;
      dVar1 = c_sqrt(dVar2 * dVar2 + dVar1 * dVar1);
      if ((bool)(bVar5 & (45.0 < dVar4 && dVar4 < 135.0))) {
        pAVar7 = this->slidemo;
        if (((pAVar7->player != (player_t *)0x0) && (0 < pAVar7->health)) &&
           ((pAVar7->player->cheats & 0x2000) == 0)) {
          local_74.ID = S_FindSound("*grunt");
          S_Sound(pAVar7,2,&local_74,1.0,1.001);
        }
        TAngle<double>::ToVector((TAngle<double> *)&local_68,dVar1 * 0.5);
        (this->tmmove).Y = local_68.y;
        (this->tmmove).X = local_68.x;
        return;
      }
      local_68.x = (ld->v1->p).X;
      local_68.y = (ld->v1->p).Y;
      local_68.dx = (ld->delta).X;
      local_68.dy = (ld->delta).Y;
      local_48.dy = -local_68.dx;
      local_48.x = dVar9;
      local_48.y = dVar10;
      local_48.dx = local_68.dy;
      dVar1 = P_InterceptVector(&local_68,&local_48);
      local_48.dx = (this->tmmove).X;
      local_48.dy = (this->tmmove).Y;
      dVar9 = P_InterceptVector(&local_68,&local_48);
      dVar2 = P_InterceptVector(&local_48,&local_68);
      if ((dVar2 == 0.0) && (!NAN(dVar2))) {
        (this->tmmove).X = 0.0;
        (this->tmmove).Y = 0.0;
        return;
      }
      (this->tmmove).X = (local_68.dx * (dVar9 - dVar1)) / dVar2;
      (this->tmmove).Y = ((dVar9 - dVar1) * local_68.dy) / dVar2;
      return;
    }
    if (bVar5) {
      dVar1 = (this->tmmove).X;
      dVar9 = (this->tmmove).Y;
      if (ABS(dVar1) < ABS(dVar9)) {
        (this->tmmove).X = dVar1 * 0.5;
        (this->tmmove).Y = dVar9 * -0.5;
        pAVar7 = this->slidemo;
        if (pAVar7->player == (player_t *)0x0) {
          return;
        }
        if (pAVar7->health < 1) {
          return;
        }
        if ((pAVar7->player->cheats & 0x2000) != 0) {
          return;
        }
        iVar6 = S_FindSound("*grunt");
        sound_id = &local_70;
        goto LAB_005112a3;
      }
    }
    (this->tmmove).Y = 0.0;
  }
  else {
    if (bVar5) {
      dVar1 = (this->tmmove).X;
      dVar9 = (this->tmmove).Y;
      if (ABS(dVar9) < ABS(dVar1)) {
        (this->tmmove).X = dVar1 * -0.5;
        (this->tmmove).Y = dVar9 * 0.5;
        pAVar7 = this->slidemo;
        if (pAVar7->player == (player_t *)0x0) {
          return;
        }
        if (pAVar7->health < 1) {
          return;
        }
        if ((pAVar7->player->cheats & 0x2000) != 0) {
          return;
        }
        iVar6 = S_FindSound("*grunt");
        sound_id = &local_6c;
LAB_005112a3:
        sound_id->ID = iVar6;
        S_Sound(pAVar7,2,sound_id,1.0,1.001);
        return;
      }
    }
    (this->tmmove).X = 0.0;
  }
  return;
}

Assistant:

void FSlide::HitSlideLine(line_t* ld)
{
	int 	side;

	DAngle lineangle;
	DAngle moveangle;
	DAngle deltaangle;

	double movelen;
	bool	icyfloor;	// is floor icy?							// phares
	//   |
	// Under icy conditions, if the angle of approach to the wall	//   V
	// is more than 45 degrees, then you'll bounce and lose half
	// your velocity. If less than 45 degrees, you'll slide along
	// the wall. 45 is arbitrary and is believable.

	// Check for the special cases of horz or vert walls.

	// killough 10/98: only bounce if hit hard (prevents wobbling)
	icyfloor =
		tmmove.LengthSquared() > 4*4 &&
		var_friction &&  // killough 8/28/98: calc friction on demand
		slidemo->Z() <= slidemo->floorz &&
		P_GetFriction(slidemo, NULL) > ORIG_FRICTION;

	if (ld->Delta().X == 0)
	{ // ST_VERTICAL
		if (icyfloor && (fabs(tmmove.X) > fabs(tmmove.Y)))
		{
			tmmove.X = -tmmove.X / 2;
			tmmove.Y /= 2; // absorb half the velocity
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!//   ^
			}
		}																		//   |
		else																	// phares
			tmmove.X = 0; // no more movement in the X direction
		return;
	}

	if (ld->Delta().Y == 0)
	{ // ST_HORIZONTAL
		if (icyfloor && (fabs(tmmove.Y) > fabs(tmmove.X)))
		{
			tmmove.X /= 2; // absorb half the velocity
			tmmove.Y = -tmmove.Y / 2;
			if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
			{
				S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
			}
		}
		else
			tmmove.Y = 0; // no more movement in the Y direction
		return;
	}

	// The wall is angled. Bounce if the angle of approach is		// phares
	// less than 45 degrees.										// phares

	DVector3 pos = slidemo->PosRelative(ld);
	side = P_PointOnLineSide(pos, ld);

	lineangle = ld->Delta().Angle();

	if (side == 1)
		lineangle += 180.;

	moveangle = tmmove.Angle();

	// prevents sudden path reversal due to rounding error |	// phares
	moveangle += 3600/65536.*65536.;		// Boom added 10 to the angle here.
	
	deltaangle = ::deltaangle(lineangle, moveangle);								//   V
	movelen = tmmove.Length();
	if (icyfloor && (deltaangle > 45) && (deltaangle < 135))
	{
		moveangle = ::deltaangle(deltaangle, lineangle);
		movelen /= 2; // absorb
		if (slidemo->player && slidemo->health > 0 && !(slidemo->player->cheats & CF_PREDICTING))
		{
			S_Sound(slidemo, CHAN_VOICE, "*grunt", 1, ATTN_IDLE); // oooff!
		}
		tmmove = moveangle.ToVector(movelen);
	}	
	else
	{	
		// The compatibility option that used to be here had to be removed because
		// with floating point math it was no longer possible to reproduce.

#if 0
		// with full precision this should work now. Needs some testing
		if (deltaangle < 0)	deltaangle += 180.;
		tmmove = lineangle.ToVector(movelen * deltaangle.Cos());
#else
		divline_t dll, dlv;
		double inter1, inter2, inter3;

		P_MakeDivline(ld, &dll);

		dlv.x = pos.X;
		dlv.y = pos.Y;
		dlv.dx = dll.dy;
		dlv.dy = -dll.dx;

		inter1 = P_InterceptVector(&dll, &dlv);

		dlv.dx = tmmove.X;
		dlv.dy = tmmove.Y;
		inter2 = P_InterceptVector(&dll, &dlv);
		inter3 = P_InterceptVector(&dlv, &dll);

		if (inter3 != 0)
		{
			tmmove.X = (inter2 - inter1) * dll.dx / inter3;
			tmmove.Y = (inter2 - inter1) * dll.dy / inter3;
		}
		else
		{
			tmmove.Zero();
		}
#endif
	}																// phares
}